

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O2

DiyFp __thiscall double_conversion::Double::AsNormalizedDiyFp(Double *this)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint64_t d64;
  bool bVar4;
  DiyFp DVar5;
  
  uVar1 = this->d64_;
  bVar4 = (uVar1 & 0x7ff0000000000000) == 0;
  uVar2 = uVar1 & 0xfffffffffffff | 0x10000000000000;
  if (bVar4) {
    uVar2 = uVar1 & 0xfffffffffffff;
  }
  iVar3 = -0x432;
  if (!bVar4) {
    iVar3 = ((uint)(uVar1 >> 0x34) & 0x7ff) - 0x433;
  }
  iVar3 = iVar3 + -0xb;
  for (; (uVar2 & 0x10000000000000) == 0; uVar2 = uVar2 * 2) {
    iVar3 = iVar3 + -1;
  }
  DVar5.f_ = uVar2 << 0xb;
  DVar5.e_ = iVar3;
  DVar5._12_4_ = 0;
  return DVar5;
}

Assistant:

DiyFp AsNormalizedDiyFp() const {
    DOUBLE_CONVERSION_ASSERT(value() > 0.0);
    uint64_t f = Significand();
    int e = Exponent();

    // The current double could be a denormal.
    while ((f & kHiddenBit) == 0) {
      f <<= 1;
      e--;
    }
    // Do the final shifts in one go.
    f <<= DiyFp::kSignificandSize - kSignificandSize;
    e -= DiyFp::kSignificandSize - kSignificandSize;
    return DiyFp(f, e);
  }